

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O1

bool __thiscall tlx::CmdlineParser::process(CmdlineParser *this,int argc,char **argv,ostream *os)

{
  Argument *pAVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  size_t sVar6;
  long *plVar7;
  ostream *poVar8;
  pointer ppAVar9;
  CmdlineParser *pCVar10;
  char *pcVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  pointer ppAVar15;
  uint local_84;
  ostream *local_80;
  char **local_78;
  CmdlineParser *local_70;
  string local_68;
  uint local_44;
  pointer local_40;
  ulong local_38;
  
  this->program_name_ = *argv;
  uVar12 = argc - 1;
  local_78 = argv + 1;
  bVar14 = 1 < argc;
  local_84 = uVar12;
  local_80 = os;
  local_70 = this;
  if (1 < argc) {
    pcVar11 = *local_78;
    iVar4 = strcmp(pcVar11,"-h");
    if (iVar4 != 0) {
      uVar13 = 1;
      do {
        iVar4 = strcmp(pcVar11,"--help");
        if (iVar4 == 0) break;
        if (uVar12 == uVar13) goto LAB_0014e084;
        bVar14 = (long)uVar13 < (long)(int)uVar12;
        pcVar11 = argv[uVar13 + 1];
        iVar4 = strcmp(pcVar11,"-h");
        uVar13 = uVar13 + 1;
      } while (iVar4 != 0);
    }
    print_usage(local_70,local_80);
    if (bVar14) {
      return false;
    }
  }
LAB_0014e084:
  ppAVar9 = (local_70->param_list_).
            super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_44 = 0;
  pCVar10 = local_70;
  poVar8 = local_80;
  do {
    poVar5 = local_80;
    if (local_84 == 0) {
      ppAVar9 = (pCVar10->param_list_).
                super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (ppAVar9 ==
          (pCVar10->param_list_).
          super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar14 = true;
      }
      else {
        bVar14 = true;
        do {
          if (((*ppAVar9)->required_ == true) && ((*ppAVar9)->found_ == false)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"Error: argument for parameter ",0x1e);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,((*ppAVar9)->longkey_)._M_dataplus._M_p,
                                ((*ppAVar9)->longkey_)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," is required!",0xd);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            bVar14 = false;
          }
          ppAVar9 = ppAVar9 + 1;
          poVar8 = local_80;
        } while (ppAVar9 !=
                 (local_70->param_list_).
                 super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      pCVar10 = local_70;
      if (!bVar14) {
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        print_usage(pCVar10,poVar8);
        return false;
      }
      return bVar14;
    }
    pcVar11 = *local_78;
    cVar2 = (char)poVar8;
    if ((*pcVar11 == '-') && ((local_44 & 1) == 0)) {
      uVar12 = local_84 - 1;
      local_78 = local_78 + 1;
      local_84 = uVar12;
      if (pcVar11[1] == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Invalid option \"",0x10);
        sVar6 = strlen(pcVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar11,sVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\".",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + cVar2);
        std::ostream::put(cVar2);
        std::ostream::flush();
LAB_0014e370:
        bVar14 = true;
      }
      else if (pcVar11[1] == '-') {
        bVar14 = true;
        if (pcVar11[2] == '-') {
          local_44 = 1;
        }
        else {
          ppAVar15 = (pCVar10->option_list_).
                     super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (ppAVar15 !=
              (pCVar10->option_list_).
              super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            do {
              iVar4 = std::__cxx11::string::compare((char *)&(*ppAVar15)->longkey_);
              if (iVar4 == 0) {
                iVar4 = (*(*ppAVar15)->_vptr_Argument[3])(*ppAVar15,&local_84,&local_78);
                poVar8 = local_80;
                if ((char)iVar4 == '\0') {
                  print_option_error(pCVar10,local_84,local_78,*ppAVar15,local_80);
                  goto LAB_0014e303;
                }
                if (pCVar10->verbose_process_ == true) {
                  std::__ostream_insert<char,std::char_traits<char>>(local_80,"Option ",7);
                  Argument::option_text_abi_cxx11_(&local_68,*ppAVar15);
                  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar8,(char *)CONCAT71(local_68._M_dataplus._M_p._1_7_,
                                                              (char)local_68._M_dataplus._M_p),
                                      local_68._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8," set to ",8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_68._M_dataplus._M_p._1_7_,(char)local_68._M_dataplus._M_p)
                      != &local_68.field_2) {
                    operator_delete((undefined1 *)
                                    CONCAT71(local_68._M_dataplus._M_p._1_7_,
                                             (char)local_68._M_dataplus._M_p),
                                    local_68.field_2._M_allocated_capacity + 1);
                  }
                  poVar8 = local_80;
                  (*(*ppAVar15)->_vptr_Argument[4])(*ppAVar15,local_80);
                  local_68._M_dataplus._M_p._0_1_ = '.';
                  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar8,(char *)&local_68,1);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
                  std::ostream::put((char)poVar8);
                  std::ostream::flush();
                  pCVar10 = local_70;
                }
                break;
              }
              ppAVar15 = ppAVar15 + 1;
            } while (ppAVar15 !=
                     (pCVar10->option_list_).
                     super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
          poVar8 = local_80;
          if (ppAVar15 ==
              (pCVar10->option_list_).
              super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_80,"Error: unknown option \"",0x17);
            sVar6 = strlen(pcVar11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar11,sVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\".",2);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            plVar7 = (long *)std::ostream::flush();
            std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
            std::ostream::put((char)plVar7);
            std::ostream::flush();
            goto LAB_0014e2f8;
          }
        }
      }
      else {
        local_40 = ppAVar9;
        local_38 = strlen(pcVar11);
        uVar13 = 1;
        do {
          bVar14 = local_84 != uVar12 || local_38 <= uVar13;
          ppAVar9 = local_40;
          if (bVar14) break;
          ppAVar9 = (pCVar10->option_list_).
                    super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppAVar15 = (pCVar10->option_list_).
                     super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          if (ppAVar9 != ppAVar15) {
            do {
              pAVar1 = *ppAVar9;
              if (pcVar11[uVar13] == pAVar1->key_) {
                uVar13 = uVar13 + 1;
                iVar4 = (*pAVar1->_vptr_Argument[3])(pAVar1,&local_84,&local_78);
                pCVar10 = local_70;
                if ((char)iVar4 == '\0') {
                  print_option_error(local_70,local_84,local_78,*ppAVar9,poVar8);
                  goto LAB_0014e5f9;
                }
                if (local_70->verbose_process_ == true) {
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Option ",7);
                  Argument::option_text_abi_cxx11_(&local_68,*ppAVar9);
                  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar8,(char *)CONCAT71(local_68._M_dataplus._M_p._1_7_,
                                                              (char)local_68._M_dataplus._M_p),
                                      local_68._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar5," set to ",8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_68._M_dataplus._M_p._1_7_,(char)local_68._M_dataplus._M_p)
                      != &local_68.field_2) {
                    operator_delete((undefined1 *)
                                    CONCAT71(local_68._M_dataplus._M_p._1_7_,
                                             (char)local_68._M_dataplus._M_p),
                                    local_68.field_2._M_allocated_capacity + 1);
                  }
                  (*(*ppAVar9)->_vptr_Argument[4])(*ppAVar9,poVar8);
                  local_68._M_dataplus._M_p._0_1_ = '.';
                  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar8,(char *)&local_68,1);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
                  poVar8 = local_80;
                  std::ostream::put((char)poVar5);
                  std::ostream::flush();
                }
                break;
              }
              ppAVar9 = ppAVar9 + 1;
            } while (ppAVar9 != ppAVar15);
          }
          pCVar10 = local_70;
          bVar3 = true;
          if (ppAVar9 ==
              (local_70->option_list_).
              super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"Error: unknown option \"",0x17);
            if (2 < local_38) {
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"-",1);
              local_68._M_dataplus._M_p._0_1_ = pcVar11[uVar13];
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,(char *)&local_68,1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" at position ",0xe);
              poVar8 = local_80;
              poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar5," in option sequence \"",0x15);
            }
            sVar6 = strlen(pcVar11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar11,sVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\".",2);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            plVar7 = (long *)std::ostream::flush();
            std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
            poVar8 = local_80;
            std::ostream::put((char)plVar7);
            std::ostream::flush();
            print_usage(pCVar10,poVar8);
LAB_0014e5f9:
            bVar3 = false;
          }
          ppAVar9 = local_40;
        } while (bVar3);
      }
    }
    else {
      if (ppAVar9 ==
          (pCVar10->param_list_).
          super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"Error: unexpected extra argument ",0x21);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
        pcVar11 = *local_78;
        if (pcVar11 == (char *)0x0) {
          std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
        }
        else {
          sVar6 = strlen(pcVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar11,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\".",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + cVar2);
        std::ostream::put(cVar2);
        plVar7 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
        poVar8 = local_80;
        std::ostream::put((char)plVar7);
        std::ostream::flush();
        local_84 = local_84 - 1;
        local_78 = local_78 + 1;
LAB_0014e2f8:
        print_usage(pCVar10,poVar8);
      }
      else {
        iVar4 = (*(*ppAVar9)->_vptr_Argument[3])(*ppAVar9,&local_84,&local_78);
        if ((char)iVar4 != '\0') {
          if (pCVar10->verbose_process_ == true) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Parameter ",10);
            Argument::param_text_abi_cxx11_(&local_68,*ppAVar9);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(char *)CONCAT71(local_68._M_dataplus._M_p._1_7_,
                                                        (char)local_68._M_dataplus._M_p),
                                local_68._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," set to ",8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_68._M_dataplus._M_p._1_7_,(char)local_68._M_dataplus._M_p) !=
                &local_68.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_68._M_dataplus._M_p._1_7_,
                                       (char)local_68._M_dataplus._M_p),
                              local_68.field_2._M_allocated_capacity + 1);
            }
            (*(*ppAVar9)->_vptr_Argument[4])(*ppAVar9,poVar8);
            local_68._M_dataplus._M_p._0_1_ = '.';
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_68,1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            poVar8 = local_80;
            std::ostream::put((char)poVar5);
            std::ostream::flush();
          }
          pAVar1 = *ppAVar9;
          pAVar1->found_ = true;
          ppAVar9 = ppAVar9 + (pAVar1->repeated_ ^ 1);
          goto LAB_0014e370;
        }
        print_param_error(pCVar10,local_84,local_78,*ppAVar9,poVar8);
      }
LAB_0014e303:
      bVar14 = false;
    }
    if (!bVar14) {
      return false;
    }
  } while( true );
}

Assistant:

bool CmdlineParser::process(
    int argc, const char* const* argv, std::ostream& os) {
    program_name_ = argv[0];
    --argc, ++argv;

    // search for help string and output help
    for (int i = 0; i < argc; ++i) {
        if (strcmp(argv[i], "-h") == 0 || strcmp(argv[i], "--help") == 0) {
            print_usage(os);
            return false;
        }
    }

    // current argument in param_list_
    ArgumentList::iterator argi = param_list_.begin();
    bool end_optlist = false;

    while (argc != 0) {
        const char* arg = argv[0];

        if (arg[0] == '-' && !end_optlist) {
            // option, advance to argument
            --argc, ++argv;
            if (arg[1] == '-') {
                if (arg[2] == '-') {
                    end_optlist = true;
                }
                else {
                    // long option
                    ArgumentList::const_iterator oi = option_list_.begin();
                    for ( ; oi != option_list_.end(); ++oi) {
                        if ((arg + 2) == (*oi)->longkey_) {
                            if (!(*oi)->process(argc, argv)) {
                                print_option_error(argc, argv, *oi, os);
                                return false;
                            }
                            else if (verbose_process_) {
                                os << "Option " << (*oi)->option_text()
                                   << " set to ";
                                (*oi)->print_value(os);
                                os << '.' << std::endl;
                            }
                            break;
                        }
                    }
                    if (oi == option_list_.end()) {
                        os << "Error: unknown option \"" << arg << "\"."
                           << std::endl << std::endl;
                        print_usage(os);
                        return false;
                    }
                }
            }
            else {
                // short option
                if (arg[1] == 0) {
                    os << "Invalid option \"" << arg << "\"." << std::endl;
                }
                else {
                    size_t offset = 1, arg_length = strlen(arg);
                    int old_argc = argc;
                    // Arguments will increase argc, so abort if it increases,
                    // while flags won't, so increase offset and parse next
                    while (offset < arg_length && argc == old_argc) {
                        ArgumentList::const_iterator oi = option_list_.begin();
                        for ( ; oi != option_list_.end(); ++oi) {
                            if (arg[offset] == (*oi)->key_) {
                                ++offset;
                                if (!(*oi)->process(argc, argv)) {
                                    print_option_error(argc, argv, *oi, os);
                                    return false;
                                }
                                else if (verbose_process_) {
                                    os << "Option "
                                       << (*oi)->option_text()
                                       << " set to ";
                                    (*oi)->print_value(os);
                                    os << '.' << std::endl;
                                }
                                break;
                            }
                        }
                        if (oi == option_list_.end()) {
                            os << "Error: unknown option \"";
                            if (arg_length > 2) {
                                // multiple short options combined
                                os << "-" << arg[offset]
                                   << "\" at position " << offset
                                   << " in option sequence \"";
                            }
                            os << arg << "\"." << std::endl << std::endl;
                            print_usage(os);
                            return false;
                        }
                    }
                }
            }
        }
        else {
            if (argi != param_list_.end()) {
                if (!(*argi)->process(argc, argv)) {
                    print_param_error(argc, argv, *argi, os);
                    return false;
                }
                else if (verbose_process_) {
                    os << "Parameter " << (*argi)->param_text() << " set to ";
                    (*argi)->print_value(os);
                    os << '.' << std::endl;
                }
                (*argi)->found_ = true;
                if (!(*argi)->repeated_)
                    ++argi;
            }
            else {
                os << "Error: unexpected extra argument "
                   << "\"" << argv[0] << "\"." << std::endl << std::endl;
                --argc, ++argv;
                print_usage(os);
                return false;
            }
        }
    }

    bool good = true;

    for (ArgumentList::const_iterator it = param_list_.begin();
         it != param_list_.end(); ++it) {
        if ((*it)->required_ && !(*it)->found_) {
            os << "Error: argument for parameter " << (*it)->longkey_
               << " is required!" << std::endl;
            good = false;
        }
    }

    if (!good) {
        os << std::endl;
        print_usage(os);
    }

    return good;
}